

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionHandler.cpp
# Opt level: O3

void __thiscall
irr::video::COpenGL3ExtensionHandler::initExtensionsNew(COpenGL3ExtensionHandler *this)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar1;
  GLuint GVar2;
  GLubyte *__s;
  GLuint GVar3;
  GLint val;
  allocator<char> local_59;
  COpenGL3ExtensionHandler *local_58;
  GLuint local_50;
  undefined4 uStack_4c;
  long local_40 [2];
  
  local_50 = 0;
  local_58 = this;
  (*GL.GetIntegerv)(0x821d,(GLint *)&local_50);
  GVar2 = local_50;
  if (0 < (int)local_50) {
    puVar1 = &local_58->Extensions;
    GVar3 = 0;
    do {
      __s = (*GL.GetStringi)(0x1f03,GVar3);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)__s,&local_59);
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_M_emplace<std::__cxx11::string>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)puVar1,(string *)&local_50);
      if ((long *)CONCAT44(uStack_4c,local_50) != local_40) {
        operator_delete((long *)CONCAT44(uStack_4c,local_50),local_40[0] + 1);
      }
      GVar3 = GVar3 + 1;
    } while (GVar2 != GVar3);
  }
  extensionsLoaded(local_58);
  return;
}

Assistant:

void COpenGL3ExtensionHandler::initExtensionsNew()
{
	int ext_count = GetInteger(GL_NUM_EXTENSIONS);
	for (int k = 0; k < ext_count; k++)
		addExtension(reinterpret_cast<const char *>(GL.GetStringi(GL_EXTENSIONS, k)));
	extensionsLoaded();
}